

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.hpp
# Opt level: O0

void __thiscall Executor::Executor(Executor *this,Context *context)

{
  Visitor *in_RDI;
  Context *in_stack_ffffffffffffffb8;
  Context *in_stack_ffffffffffffffc0;
  
  Visitor::Visitor(in_RDI);
  in_RDI->_vptr_Visitor = (_func_int **)&PTR__Executor_002b1538;
  std::unique_ptr<Value,std::default_delete<Value>>::unique_ptr<std::default_delete<Value>,void>
            ((unique_ptr<Value,_std::default_delete<Value>_> *)in_stack_ffffffffffffffc0);
  Context::Context(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::
  stack<std::unique_ptr<Value,std::default_delete<Value>>,std::deque<std::unique_ptr<Value,std::default_delete<Value>>,std::allocator<std::unique_ptr<Value,std::default_delete<Value>>>>>
  ::
  stack<std::deque<std::unique_ptr<Value,std::default_delete<Value>>,std::allocator<std::unique_ptr<Value,std::default_delete<Value>>>>,void>
            ((stack<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::deque<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::allocator<std::unique_ptr<Value,_std::default_delete<Value>_>_>_>_>
              *)(in_RDI + 0xc));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(in_RDI + 0x16));
  *(undefined4 *)&in_RDI[0x45]._vptr_Visitor = 0;
  return;
}

Assistant:

Executor(const Context& context): value_(), context_(context), returnStack_(), stdout_(), exitCode_(0) {}